

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O0

int libssh2_sign_sk(LIBSSH2_SESSION *session,uchar **sig,size_t *sig_len,uchar *data,size_t data_len
                   ,void **abstract)

{
  uchar *puVar1;
  uchar *local_98;
  uchar *x;
  uchar *p;
  LIBSSH2_SK_SIG_INFO sig_info;
  LIBSSH2_PRIVKEY_SK *sk_info;
  int rc;
  void **abstract_local;
  size_t data_len_local;
  uchar *data_local;
  size_t *sig_len_local;
  uchar **sig_local;
  LIBSSH2_SESSION *session_local;
  
  sig_info.sig_s_len = (size_t)*abstract;
  memset(&p,0,0x28);
  if (*(long *)(sig_info.sig_s_len + 0x18) == 0) {
    session_local._4_4_ = -0xc;
  }
  else {
    sk_info._4_4_ =
         (**(code **)(sig_info.sig_s_len + 0x20))
                   (session,&p,data,data_len,*(undefined4 *)sig_info.sig_s_len,
                    *(undefined1 *)(sig_info.sig_s_len + 4),*(undefined8 *)(sig_info.sig_s_len + 8),
                    *(undefined8 *)(sig_info.sig_s_len + 0x10),
                    *(undefined8 *)(sig_info.sig_s_len + 0x18),
                    *(undefined8 *)(sig_info.sig_s_len + 0x28));
    if (((sk_info._4_4_ == 0) && (sig_info.sig_r != (uchar *)0x0)) && (sig_info._0_8_ != 0)) {
      x = (uchar *)0x0;
      if ((sig_info.sig_s == (uchar *)0x0) || (sig_info.sig_r_len == 0)) {
        *sig_len = (size_t)(sig_info.sig_r + 9);
        puVar1 = (uchar *)(*session->alloc)(*sig_len,&session->abstract);
        *sig = puVar1;
        if (*sig == (uchar *)0x0) {
          sk_info._4_4_ = -6;
        }
        else {
          x = *sig;
          _libssh2_store_str(&x,(char *)sig_info._0_8_,(size_t)sig_info.sig_r);
        }
      }
      else {
        *sig_len = (size_t)(sig_info.sig_r + (long)sig_info.sig_s + 0x13);
        puVar1 = (uchar *)(*session->alloc)(*sig_len,&session->abstract);
        *sig = puVar1;
        if (*sig == (uchar *)0x0) {
          sk_info._4_4_ = -6;
        }
        else {
          local_98 = *sig;
          x = *sig;
          _libssh2_store_u32(&x,0);
          _libssh2_store_bignum2_bytes(&x,(uchar *)sig_info._0_8_,(size_t)sig_info.sig_r);
          _libssh2_store_bignum2_bytes(&x,(uchar *)sig_info.sig_r_len,(size_t)sig_info.sig_s);
          *sig_len = (long)x - (long)*sig;
          _libssh2_store_u32(&local_98,(int)*sig_len - 4);
        }
      }
      if (x != (uchar *)0x0) {
        *x = (uchar)p;
        x = x + 1;
        _libssh2_store_u32(&x,p._4_4_);
        *sig_len = (long)x - (long)*sig;
      }
      (*session->free)((void *)sig_info._0_8_,&session->abstract);
      if (sig_info.sig_r_len != 0) {
        (*session->free)((void *)sig_info.sig_r_len,&session->abstract);
      }
    }
    else {
      *sig_len = 0;
    }
    session_local._4_4_ = sk_info._4_4_;
  }
  return session_local._4_4_;
}

Assistant:

int
libssh2_sign_sk(LIBSSH2_SESSION *session, unsigned char **sig, size_t *sig_len,
                const unsigned char *data, size_t data_len, void **abstract)
{
    int rc = LIBSSH2_ERROR_DECRYPT;
    LIBSSH2_PRIVKEY_SK *sk_info = (LIBSSH2_PRIVKEY_SK *) (*abstract);
    LIBSSH2_SK_SIG_INFO sig_info = { 0 };

    if(sk_info->handle_len <= 0) {
        return LIBSSH2_ERROR_DECRYPT;
    }

    rc = sk_info->sign_callback(session,
                                &sig_info,
                                data,
                                data_len,
                                sk_info->algorithm,
                                sk_info->flags,
                                sk_info->application,
                                sk_info->key_handle,
                                sk_info->handle_len,
                                sk_info->orig_abstract);

    if(rc == 0 && sig_info.sig_r_len > 0 && sig_info.sig_r) {
        unsigned char *p = NULL;

        if(sig_info.sig_s_len > 0 && sig_info.sig_s) {
            /* sig length, sig_r, sig_s, flags, counter, plus 4 bytes for each
               component's length, and up to 1 extra byte for each component */
            *sig_len = 4 + 5 + sig_info.sig_r_len + 5 + sig_info.sig_s_len + 5;
            *sig = LIBSSH2_ALLOC(session, *sig_len);

            if(*sig) {
                unsigned char *x = *sig;
                p = *sig;

                _libssh2_store_u32(&p, 0);

                _libssh2_store_bignum2_bytes(&p,
                                             sig_info.sig_r,
                                             sig_info.sig_r_len);

                _libssh2_store_bignum2_bytes(&p,
                                             sig_info.sig_s,
                                             sig_info.sig_s_len);

                *sig_len = p - *sig;

                _libssh2_store_u32(&x, (uint32_t)(*sig_len - 4));
            }
            else {
                _libssh2_debug((session,
                               LIBSSH2_ERROR_ALLOC,
                               "Unable to allocate ecdsa-sk signature."));
                rc = LIBSSH2_ERROR_ALLOC;
            }
        }
        else {
            /* sig, flags, counter, plus 4 bytes for sig length. */
            *sig_len = 4 + sig_info.sig_r_len + 1 + 4;
            *sig = LIBSSH2_ALLOC(session, *sig_len);

            if(*sig) {
                p = *sig;

                _libssh2_store_str(&p,
                                   (const char *)sig_info.sig_r,
                                   sig_info.sig_r_len);
            }
            else {
                _libssh2_debug((session,
                               LIBSSH2_ERROR_ALLOC,
                               "Unable to allocate ed25519-sk signature."));
                rc = LIBSSH2_ERROR_ALLOC;
            }
        }

        if(p) {
            *p = sig_info.flags;
            ++p;
            _libssh2_store_u32(&p, sig_info.counter);

            *sig_len = p - *sig;
        }

        LIBSSH2_FREE(session, sig_info.sig_r);

        if(sig_info.sig_s) {
            LIBSSH2_FREE(session, sig_info.sig_s);
        }
    }
    else {
        _libssh2_debug((session,
                       LIBSSH2_ERROR_DECRYPT,
                       "sign_callback failed or returned invalid signature."));
        *sig_len = 0;
    }

    return rc;
}